

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::(anonymous_namespace)::OffsetsGatherDepth2DRect::TextBody_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (**(code **)(*this + 0xb8))(&local_30);
  std::operator+(__return_storage_ptr__,&local_30,
                 " test_function(vec4 p) {                                                             \n    const ivec2 offsets[4] = ivec2[](ivec2(7, 6), ivec2(-8, 7), ivec2(-6, -5), ivec2(-1, 3)); \n    return textureGatherOffsets(my_sampler, vec2(p.x, p.y), p.z, offsets);                    \n}\n"
                );
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string TextBody()
	{
		return Type() +
			   " test_function(vec4 p) {                                                             \n"
			   "    const ivec2 offsets[4] = ivec2[](ivec2(7, 6), ivec2(-8, 7), ivec2(-6, -5), ivec2(-1, 3)); \n"
			   "    return textureGatherOffsets(my_sampler, vec2(p.x, p.y), p.z, offsets);                    \n"
			   "}\n";
	}